

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
__thiscall duckdb::ClientContext::LockContext(ClientContext *this)

{
  int iVar1;
  element_type *peVar2;
  long in_RSI;
  
  peVar2 = (element_type *)operator_new(8);
  *(pthread_mutex_t **)&(peVar2->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_
       = (pthread_mutex_t *)(in_RSI + 0x240);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x240));
  if (iVar1 == 0) {
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    return (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           this;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

unique_ptr<ClientContextLock> ClientContext::LockContext() {
	return make_uniq<ClientContextLock>(context_lock);
}